

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool>
* __thiscall
pstore::json::details::number_matcher<pstore::json::null_output>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool>
           *__return_storage_ptr__,number_matcher<pstore::json::null_output> *this,
          parser<pstore::json::null_output> *parser,maybe<char,_void> *ch)

{
  maybe<char,_void> *parser_00;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  void *local_48;
  error_code local_40;
  char local_2a;
  bool local_29;
  char c;
  maybe<char,_void> *pmStack_28;
  bool match;
  maybe<char,_void> *ch_local;
  parser<pstore::json::null_output> *parser_local;
  number_matcher<pstore::json::null_output> *this_local;
  
  local_29 = true;
  pmStack_28 = ch;
  ch_local = (maybe<char,_void> *)parser;
  parser_local = (parser<pstore::json::null_output> *)this;
  this_local = (number_matcher<pstore::json::null_output> *)__return_storage_ptr__;
  bVar1 = maybe::operator_cast_to_bool((maybe *)ch);
  if (bVar1) {
    pcVar3 = maybe<char,_void>::operator*(ch);
    local_2a = *pcVar3;
    iVar2 = matcher<pstore::json::null_output>::get_state
                      (&this->super_matcher<pstore::json::null_output>);
    switch(iVar2) {
    case 1:
      assert_failed("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x30a);
    case 2:
      local_29 = do_leading_minus_state(this,(parser<pstore::json::null_output> *)ch_local,local_2a)
      ;
      break;
    case 3:
      local_29 = do_integer_initial_digit_state
                           (this,(parser<pstore::json::null_output> *)ch_local,local_2a);
      break;
    case 4:
      local_29 = do_integer_digit_state(this,(parser<pstore::json::null_output> *)ch_local,local_2a)
      ;
      break;
    case 5:
      local_29 = do_frac_state(this,(parser<pstore::json::null_output> *)ch_local,local_2a);
      break;
    case 6:
    case 7:
      local_29 = do_frac_digit_state(this,(parser<pstore::json::null_output> *)ch_local,local_2a);
      break;
    case 8:
      local_29 = do_exponent_sign_state(this,(parser<pstore::json::null_output> *)ch_local,local_2a)
      ;
      break;
    case 9:
    case 10:
      local_29 = do_exponent_digit_state
                           (this,(parser<pstore::json::null_output> *)ch_local,local_2a);
    }
  }
  else {
    bVar1 = parser<pstore::json::null_output>::has_error
                      ((parser<pstore::json::null_output> *)ch_local);
    if (bVar1) {
      assert_failed("!parser.has_error ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x30d);
    }
    bVar1 = in_terminal_state(this);
    parser_00 = ch_local;
    if (!bVar1) {
      std::error_code::error_code<pstore::json::error_code,void>(&local_40,expected_digits);
      matcher<pstore::json::null_output>::set_error
                (&this->super_matcher<pstore::json::null_output>,
                 (parser<pstore::json::null_output> *)parser_00,&local_40);
    }
    complete(this,(parser<pstore::json::null_output> *)ch_local);
  }
  local_48 = (void *)0x0;
  std::
  pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool>
  ::pair<std::nullptr_t,_bool_&,_true>(__return_storage_ptr__,&local_48,&local_29);
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            number_matcher<Callbacks>::consume (parser<Callbacks> & parser, maybe<char> ch) {
                bool match = true;
                if (ch) {
                    char const c = *ch;
                    switch (this->get_state ()) {
                    case leading_minus_state:
                        match = this->do_leading_minus_state (parser, c);
                        break;
                    case integer_initial_digit_state:
                        match = this->do_integer_initial_digit_state (parser, c);
                        break;
                    case integer_digit_state:
                        match = this->do_integer_digit_state (parser, c);
                        break;
                    case frac_state: match = this->do_frac_state (parser, c); break;
                    case frac_initial_digit_state:
                    case frac_digit_state: match = this->do_frac_digit_state (parser, c); break;
                    case exponent_sign_state:
                        match = this->do_exponent_sign_state (parser, c);
                        break;
                    case exponent_initial_digit_state:
                    case exponent_digit_state:
                        match = this->do_exponent_digit_state (parser, c);
                        break;
                    case done_state: PSTORE_ASSERT (false); break;
                    }
                } else {
                    PSTORE_ASSERT (!parser.has_error ());
                    if (!this->in_terminal_state ()) {
                        this->set_error (parser, error_code::expected_digits);
                    }
                    this->complete (parser);
                }
                return {nullptr, match};
            }